

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDF_ERROR_CODE qpdf_remove_page(qpdf_data qpdf,qpdf_oh page)

{
  QPDF_ERROR_CODE QVar1;
  QPDFObjectHandle p;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  code *local_20;
  code *local_18;
  
  qpdf_oh_item_internal((qpdf_data)local_40,(qpdf_oh)qpdf);
  local_30._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_18 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1891:30)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1891:30)>
             ::_M_manager;
  local_30._0_8_ = (qpdf_data)local_40;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)(local_40 + 0x10));
  std::_Function_base::~_Function_base((_Function_base *)(local_40 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_remove_page(qpdf_data qpdf, qpdf_oh page)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_remove_page");
    auto p = qpdf_oh_item_internal(qpdf, page);
    return trap_errors(qpdf, [&p](qpdf_data q) { q->qpdf->removePage(p); });
}